

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Method_dispatcher_manager::enable_introspection(Method_dispatcher_manager *this)

{
  Default_method_dispatcher *this_00;
  System_method_factory<iqxmlrpc::builtins::List_methods> *this_01;
  allocator<char> local_31;
  string local_30;
  Method_dispatcher_manager *local_10;
  Method_dispatcher_manager *this_local;
  
  this_00 = this->impl_->default_disp;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"system.listMethods",&local_31);
  this_01 = (System_method_factory<iqxmlrpc::builtins::List_methods> *)operator_new(0x10);
  System_method_factory<iqxmlrpc::builtins::List_methods>::System_method_factory(this_01,this);
  Default_method_dispatcher::register_method(this_00,&local_30,(Method_factory_base *)this_01);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void Method_dispatcher_manager::enable_introspection()
{
  impl_->default_disp->register_method("system.listMethods",
    new System_method_factory<builtins::List_methods>(this));
}